

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O1

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  Mat local_98;
  Option *local_58;
  int local_4c;
  int local_48;
  int local_44;
  Mat *local_40;
  Mat *local_38;
  
  uVar14 = bottom_blob->dims;
  local_48 = bottom_blob->w;
  local_4c = bottom_blob->h;
  local_44 = bottom_blob->c;
  pvVar1 = (this->axes).data;
  if ((pvVar1 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar15 = this->squeeze_w != 0 && local_48 == 1;
    bVar10 = this->squeeze_h != 0 && local_4c == 1;
    bVar11 = this->squeeze_c != 0 && local_44 == 1;
  }
  else {
    lVar9 = (long)(this->axes).w;
    if (lVar9 < 1) {
      bVar15 = false;
      bVar10 = false;
      bVar11 = false;
    }
    else {
      bVar16 = local_48 == 1;
      lVar12 = 0;
      bVar10 = false;
      bVar15 = false;
      bVar6 = false;
      do {
        iVar13 = *(int *)((long)pvVar1 + lVar12 * 4);
        iVar13 = (iVar13 >> 0x1f & uVar14 + 1) + iVar13;
        bVar3 = bVar15;
        bVar5 = bVar10;
        bVar11 = bVar6;
        if (iVar13 == 1) {
          bVar3 = bVar16;
          bVar5 = local_4c == 1;
          bVar11 = local_44 == 1;
        }
        if (uVar14 != 2) {
          bVar5 = bVar10;
        }
        if (uVar14 != 1) {
          bVar3 = bVar15;
        }
        bVar4 = bVar3;
        bVar10 = bVar5;
        if (iVar13 == 2) {
          bVar4 = bVar16;
          bVar10 = local_4c == 1;
        }
        if (uVar14 != 2) {
          bVar4 = bVar3;
        }
        bVar15 = bVar4;
        if (iVar13 == 3) {
          bVar15 = bVar16;
        }
        if (uVar14 != 3) {
          bVar15 = bVar4;
          bVar10 = bVar5;
          bVar11 = bVar6;
        }
        lVar12 = lVar12 + 1;
        local_58 = opt;
        local_40 = top_blob;
        local_38 = bottom_blob;
        bVar6 = bVar11;
      } while (lVar9 != lVar12);
    }
  }
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data == (void *)0x0) goto LAB_0015f712;
          local_40 = (Mat *)(ulong)uVar14;
          free(top_blob->data);
        }
        else {
          local_40 = (Mat *)(ulong)uVar14;
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
        uVar14 = (uint)local_40;
      }
    }
LAB_0015f712:
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar13 = bottom_blob->w;
    iVar7 = bottom_blob->h;
    iVar8 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar13;
    top_blob->h = iVar7;
    top_blob->c = iVar8;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (uVar14 != 3) {
    if (uVar14 != 2) {
      if ((uVar14 == 1) && (bVar15)) {
        local_58 = opt;
        Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (**(code **)(*(long *)local_98.allocator + 0x18))();
            }
          }
        }
      }
      goto LAB_0016025f;
    }
    if (bVar15) {
      if (bVar10) {
        local_58 = opt;
        Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0016025f;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0016025f;
        }
      }
      else {
        local_58 = opt;
        Mat::reshape(&local_98,bottom_blob,local_4c,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0016025f;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0016025f;
        }
      }
    }
    else {
      if (!bVar10) goto LAB_0016025f;
      local_58 = opt;
      Mat::reshape(&local_98,bottom_blob,local_48,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0016025f;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0016025f;
      }
    }
    if (local_98.data != (void *)0x0) {
      free(local_98.data);
    }
    goto LAB_0016025f;
  }
  if ((bool)(bVar15 & bVar10)) {
    if (bVar11) {
      Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0016025f;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0016025f;
      }
    }
    else {
      if (!bVar10) goto LAB_0015fcd8;
      Mat::reshape(&local_98,bottom_blob,local_44,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0016025f;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0016025f;
      }
    }
  }
  else if ((bool)(bVar10 & bVar11)) {
    Mat::reshape(&local_98,bottom_blob,local_48,opt->blob_allocator);
    if (&local_98 != top_blob) {
      if (local_98.refcount != (int *)0x0) {
        LOCK();
        *local_98.refcount = *local_98.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_98.data;
      top_blob->refcount = local_98.refcount;
      top_blob->elemsize = local_98.elemsize;
      top_blob->elempack = local_98.elempack;
      top_blob->allocator = local_98.allocator;
      top_blob->dims = local_98.dims;
      top_blob->w = local_98.w;
      top_blob->h = local_98.h;
      top_blob->c = local_98.c;
      top_blob->cstep = local_98.cstep;
    }
    if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount != 0) goto LAB_0016025f;
    if (local_98.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_98.allocator + 0x18))();
      goto LAB_0016025f;
    }
  }
  else {
LAB_0015fcd8:
    if (bVar15) {
      if (bVar11) {
        Mat::reshape(&local_98,bottom_blob,local_4c,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0016025f;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0016025f;
        }
      }
      else {
        Mat::reshape(&local_98,bottom_blob,local_4c,local_44,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0016025f;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0016025f;
        }
      }
    }
    else if (bVar10) {
      Mat::reshape(&local_98,bottom_blob,local_48,local_44,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0016025f;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0016025f;
      }
    }
    else {
      if (!bVar11) goto LAB_0016025f;
      Mat::reshape(&local_98,bottom_blob,local_48,local_4c,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0016025f;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0016025f;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0016025f;
      }
    }
  }
  if (local_98.data != (void *)0x0) {
    free(local_98.data);
  }
LAB_0016025f:
  if (top_blob->data == (void *)0x0) {
    iVar13 = -100;
  }
  else {
    iVar13 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i=0; i<axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;// +1 for N-dim

            if (dims == 1 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}